

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O3

void __thiscall MercuryJson::JSON::exec_stage1(JSON *this)

{
  size_t *psVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  char *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  runtime_error *this_00;
  ulong uVar16;
  size_t i_1;
  ulong uVar17;
  ulong uVar18;
  size_t *psVar19;
  ulong uVar20;
  ulong in_RSI;
  ulong uVar21;
  ulong uVar22;
  size_t sVar23;
  size_t i;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  bool bVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  
  sVar23 = this->input_len;
  if (sVar23 == 0) {
    sVar14 = this->num_indices;
    psVar19 = this->indices;
    bVar29 = true;
    uVar28 = 0xffffffffffffffc0;
    uVar21 = 0;
    uVar18 = 0;
  }
  else {
    pcVar4 = this->input;
    auVar30[8] = 0x5c;
    auVar30._0_8_ = 0x5c5c5c5c5c5c5c5c;
    auVar30[9] = 0x5c;
    auVar30[10] = 0x5c;
    auVar30[0xb] = 0x5c;
    auVar30[0xc] = 0x5c;
    auVar30[0xd] = 0x5c;
    auVar30[0xe] = 0x5c;
    auVar30[0xf] = 0x5c;
    auVar30[0x10] = 0x5c;
    auVar30[0x11] = 0x5c;
    auVar30[0x12] = 0x5c;
    auVar30[0x13] = 0x5c;
    auVar30[0x14] = 0x5c;
    auVar30[0x15] = 0x5c;
    auVar30[0x16] = 0x5c;
    auVar30[0x17] = 0x5c;
    auVar30[0x18] = 0x5c;
    auVar30[0x19] = 0x5c;
    auVar30[0x1a] = 0x5c;
    auVar30[0x1b] = 0x5c;
    auVar30[0x1c] = 0x5c;
    auVar30[0x1d] = 0x5c;
    auVar30[0x1e] = 0x5c;
    auVar30[0x1f] = 0x5c;
    auVar31[8] = 0x22;
    auVar31._0_8_ = 0x2222222222222222;
    auVar31[9] = 0x22;
    auVar31[10] = 0x22;
    auVar31[0xb] = 0x22;
    auVar31[0xc] = 0x22;
    auVar31[0xd] = 0x22;
    auVar31[0xe] = 0x22;
    auVar31[0xf] = 0x22;
    auVar31[0x10] = 0x22;
    auVar31[0x11] = 0x22;
    auVar31[0x12] = 0x22;
    auVar31[0x13] = 0x22;
    auVar31[0x14] = 0x22;
    auVar31[0x15] = 0x22;
    auVar31[0x16] = 0x22;
    auVar31[0x17] = 0x22;
    auVar31[0x18] = 0x22;
    auVar31[0x19] = 0x22;
    auVar31[0x1a] = 0x22;
    auVar31[0x1b] = 0x22;
    auVar31[0x1c] = 0x22;
    auVar31[0x1d] = 0x22;
    auVar31[0x1e] = 0x22;
    auVar31[0x1f] = 0x22;
    auVar32._8_2_ = 0xf7f;
    auVar32._0_8_ = 0xf7f0f7f0f7f0f7f;
    auVar32._10_2_ = 0xf7f;
    auVar32._12_2_ = 0xf7f;
    auVar32._14_2_ = 0xf7f;
    auVar32._16_2_ = 0xf7f;
    auVar32._18_2_ = 0xf7f;
    auVar32._20_2_ = 0xf7f;
    auVar32._22_2_ = 0xf7f;
    auVar32._24_2_ = 0xf7f;
    auVar32._26_2_ = 0xf7f;
    auVar32._28_2_ = 0xf7f;
    auVar32._30_2_ = 0xf7f;
    auVar33._16_16_ = _DAT_00116d60;
    auVar33._0_16_ = _DAT_00116d60;
    auVar34._16_16_ = _DAT_00116d70;
    auVar34._0_16_ = _DAT_00116d70;
    auVar35[8] = 0x18;
    auVar35._0_8_ = 0x1818181818181818;
    auVar35[9] = 0x18;
    auVar35[10] = 0x18;
    auVar35[0xb] = 0x18;
    auVar35[0xc] = 0x18;
    auVar35[0xd] = 0x18;
    auVar35[0xe] = 0x18;
    auVar35[0xf] = 0x18;
    auVar35[0x10] = 0x18;
    auVar35[0x11] = 0x18;
    auVar35[0x12] = 0x18;
    auVar35[0x13] = 0x18;
    auVar35[0x14] = 0x18;
    auVar35[0x15] = 0x18;
    auVar35[0x16] = 0x18;
    auVar35[0x17] = 0x18;
    auVar35[0x18] = 0x18;
    auVar35[0x19] = 0x18;
    auVar35[0x1a] = 0x18;
    auVar35[0x1b] = 0x18;
    auVar35[0x1c] = 0x18;
    auVar35[0x1d] = 0x18;
    auVar35[0x1e] = 0x18;
    auVar35[0x1f] = 0x18;
    auVar36[8] = 7;
    auVar36._0_8_ = 0x707070707070707;
    auVar36[9] = 7;
    auVar36[10] = 7;
    auVar36[0xb] = 7;
    auVar36[0xc] = 7;
    auVar36[0xd] = 7;
    auVar36[0xe] = 7;
    auVar36[0xf] = 7;
    auVar36[0x10] = 7;
    auVar36[0x11] = 7;
    auVar36[0x12] = 7;
    auVar36[0x13] = 7;
    auVar36[0x14] = 7;
    auVar36[0x15] = 7;
    auVar36[0x16] = 7;
    auVar36[0x17] = 7;
    auVar36[0x18] = 7;
    auVar36[0x19] = 7;
    auVar36[0x1a] = 7;
    auVar36[0x1b] = 7;
    auVar36[0x1c] = 7;
    auVar36[0x1d] = 7;
    auVar36[0x1e] = 7;
    auVar36[0x1f] = 7;
    psVar19 = this->indices;
    uVar17 = 1;
    auVar5 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    uVar21 = 0;
    uVar27 = 0;
    uVar22 = 0;
    sVar14 = this->num_indices;
    uVar18 = 0;
    do {
      uVar28 = uVar18;
      auVar2 = *(undefined1 (*) [32])(pcVar4 + uVar28 + 0x20);
      auVar3 = *(undefined1 (*) [32])(pcVar4 + uVar28);
      lVar24 = vpcmpeqb_avx512vl(auVar2,auVar30);
      uVar7 = vpcmpeqb_avx512vl(auVar3,auVar30);
      uVar20 = lVar24 << 0x20 | CONCAT44((int)((ulong)pcVar4 >> 0x20),(int)uVar7);
      uVar26 = ~(uVar20 * 2) & uVar20;
      uVar18 = uVar26 & 0xaaaaaaaaaaaaaaaa | uVar27;
      if (uVar21 != 0) {
        lVar24 = 0;
        uVar16 = uVar21;
        do {
          do {
            lVar13 = 0;
            for (uVar25 = uVar16; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
              lVar13 = lVar13 + 1;
            }
            uVar16 = uVar16 - 1 & uVar16;
            psVar19[this->num_indices + lVar24] = lVar13 + (uVar28 - 0x40);
            lVar24 = lVar24 + 1;
          } while (lVar24 != 8);
          this->num_indices = this->num_indices + 8;
          lVar24 = 0;
        } while (uVar16 != 0);
        sVar23 = this->input_len;
      }
      uVar7 = vpcmpeqb_avx512vl(auVar2,auVar31);
      uVar8 = vpcmpeqb_avx512vl(auVar3,auVar31);
      uVar26 = uVar26 & 0x5555555555555555 ^ uVar27;
      uVar27 = (ulong)CARRY8(uVar18,uVar20);
      sVar14 = sVar14 + POPCOUNT(uVar21);
      this->num_indices = sVar14;
      uVar26 = (uVar18 + uVar20 ^ uVar20) & 0x5555555555555555 |
               (uVar26 + uVar20 ^ uVar20) & 0xaaaaaaaaaaaaaaaa;
      uVar18 = uVar28 + 0x40;
      uVar20 = ~uVar26 & (CONCAT44(0x55555555,(int)uVar7) << 0x20 |
                         CONCAT44((int)(in_RSI >> 0x20),(int)uVar8));
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar20;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = auVar5._0_8_;
      auVar10 = (undefined1  [16])0x0;
      for (uVar9 = 0; uVar9 < 0x40; uVar9 = uVar9 + 1) {
        if ((auVar11 & (undefined1  [16])0x1 << uVar9) != (undefined1  [16])0x0) {
          auVar10 = auVar10 ^ auVar12 << uVar9;
        }
      }
      auVar37 = vpsrlw_avx2(auVar2,4);
      auVar6 = vpshufb_avx2(auVar34,auVar2);
      auVar2 = vpand_avx2(auVar37,auVar32);
      uVar16 = auVar10._0_8_ ^ uVar22;
      auVar2 = vpshufb_avx2(auVar33,auVar2);
      uVar22 = (long)uVar16 >> 0x3f;
      auVar2 = vpand_avx2(auVar6,auVar2);
      auVar37 = vpsrlw_avx2(auVar3,4);
      auVar6 = vpshufb_avx2(auVar34,auVar3);
      auVar3 = vpand_avx2(auVar37,auVar32);
      lVar24 = vptestnmb_avx512vl(auVar2,auVar35);
      auVar3 = vpshufb_avx2(auVar33,auVar3);
      auVar3 = vpand_avx2(auVar6,auVar3);
      uVar7 = vptestnmb_avx512vl(auVar3,auVar35);
      uVar8 = vptestnmb_avx512vl(auVar3,auVar36);
      lVar13 = vptestnmb_avx512vl(auVar2,auVar36);
      in_RSI = lVar24 << 0x20 | CONCAT44((int)(uVar26 >> 0x20),(int)uVar7);
      uVar25 = ~(lVar13 << 0x20 | CONCAT44((int)(uVar21 >> 0x20),(int)uVar8) | uVar16);
      uVar26 = ~(in_RSI | uVar16) | uVar25;
      uVar21 = uVar17 + uVar26 * 2;
      uVar17 = uVar26 >> 0x3f;
      uVar21 = (~uVar20 | uVar16) & (uVar25 | uVar20 | ~uVar16 & uVar21 & in_RSI);
    } while (uVar18 < sVar23);
    bVar29 = -1 < (long)uVar16;
    psVar1 = &this->num_indices;
    if (uVar21 == 0) {
      uVar21 = 0;
    }
    else {
      lVar24 = 0;
      uVar17 = uVar21;
      do {
        do {
          lVar13 = 0;
          for (uVar22 = uVar17; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
            lVar13 = lVar13 + 1;
          }
          uVar17 = uVar17 - 1 & uVar17;
          psVar19[*psVar1 + lVar24] = lVar13 + uVar28;
          lVar24 = lVar24 + 1;
        } while (lVar24 != 8);
        *psVar1 = *psVar1 + 8;
        lVar24 = 0;
      } while (uVar17 != 0);
    }
  }
  sVar14 = POPCOUNT(uVar21) + sVar14;
  this->num_indices = sVar14;
  if ((sVar14 == 0) || (this->input[psVar19[sVar14 - 1]] != '\0')) {
    sVar15 = strlen(this->input + (uVar18 - 0x40));
    this->num_indices = sVar14 + 1;
    psVar19[sVar14] = sVar15 + uVar28;
  }
  if (!bVar29) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"unclosed quotation marks");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void JSON::exec_stage1() {
        uint64_t prev_escape_mask = 0;
        uint64_t prev_quote_mask = 0;
        uint64_t prev_pseudo_mask = 1;  // initial value set to 1 to allow literals at beginning of input
        uint64_t quote_mask, structural_mask, whitespace_mask;
        uint64_t pseudo_mask = 0;
        size_t offset = 0;
        for (; offset < input_len; offset += 64) {
            Warp warp(input + offset);
            uint64_t escape_mask = extract_escape_mask(warp, &prev_escape_mask);
            uint64_t literal_mask = extract_literal_mask(warp, escape_mask, &prev_quote_mask, &quote_mask);

            // Dump pointers for *previous* iteration.
            construct_structural_character_pointers(pseudo_mask, offset - 64, indices, &num_indices);

            extract_structural_whitespace_characters(warp, literal_mask, &structural_mask, &whitespace_mask);
            pseudo_mask = extract_pseudo_structural_mask(
                    structural_mask, whitespace_mask, quote_mask, literal_mask, &prev_pseudo_mask);
        }
        // Dump pointers for the final iteration.
        construct_structural_character_pointers(pseudo_mask, offset - 64, indices, &num_indices);
        if (num_indices == 0 || input[indices[num_indices - 1]] != '\0')  // Ensure '\0' is added to indices.
            indices[num_indices++] = offset - 64 + strlen(input + offset - 64);
        if (prev_quote_mask != 0)
            throw std::runtime_error("unclosed quotation marks");
    }